

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O3

void C_ArchiveAliases(FConfigFile *f)

{
  int iVar1;
  FConsoleAlias *this;
  long lVar2;
  
  lVar2 = 0;
  do {
    for (this = (FConsoleAlias *)Commands[lVar2]; this != (FConsoleAlias *)0x0;
        this = (FConsoleAlias *)(this->super_FConsoleCommand).m_Next) {
      iVar1 = (*(this->super_FConsoleCommand)._vptr_FConsoleCommand[2])(this);
      if ((char)iVar1 != '\0') {
        FConsoleAlias::Archive(this,f);
      }
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xfb);
  return;
}

Assistant:

void C_ArchiveAliases (FConfigFile *f)
{
	int bucket;
	FConsoleCommand *alias;

	for (bucket = 0; bucket < FConsoleCommand::HASH_SIZE; bucket++)
	{
		alias = Commands[bucket];
		while (alias)
		{
			if (alias->IsAlias())
				static_cast<FConsoleAlias *>(alias)->Archive (f);
			alias = alias->m_Next;
		}
	}
}